

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::route
          (HttpRouter<uWS::HttpContextData<false>::RouterData> *this,string_view method,
          string_view url)

{
  pointer puVar1;
  Node *pNVar2;
  byte in_AL;
  pointer puVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  (this->currentUrl)._M_len = url._M_len;
  (this->currentUrl)._M_str = url._M_str;
  this->urlSegmentTop = -1;
  (this->routeParameters).paramsTop = -1;
  puVar3 = (this->root).children.
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->root).children.
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar1) {
LAB_00167d55:
      return (bool)(puVar3 != puVar1 & in_AL);
    }
    pNVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
             .
             super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
             ._M_head_impl;
    __x._M_str = (pNVar2->name)._M_dataplus._M_p;
    __x._M_len = (pNVar2->name)._M_string_length;
    in_AL = std::operator==(__x,method);
    if ((bool)in_AL) {
      in_AL = executeHandlers(this,(puVar3->_M_t).
                                   super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                                   .
                                   super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                                   ._M_head_impl,0,&this->userData);
      goto LAB_00167d55;
    }
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

bool route(std::string_view method, std::string_view url) {
        /* Reset url parsing cache */
        setUrl(url);
        routeParameters.reset();

        /* Begin by finding the method node */
        for (auto &p : root.children) {
            if (p->name == method) {
                /* Then route the url */
                return executeHandlers(p.get(), 0, userData);
            }
        }

        /* We did not find any handler for this method and url */
        return false;
    }